

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Ptr<Catch::IStreamingReporter> * __thiscall
Catch::Ptr<Catch::IStreamingReporter>::operator=
          (Ptr<Catch::IStreamingReporter> *this,Ptr<Catch::IStreamingReporter> *other)

{
  IStreamingReporter *pIVar1;
  IStreamingReporter *pIVar2;
  
  pIVar1 = other->m_p;
  if (pIVar1 != (IStreamingReporter *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
  }
  pIVar2 = this->m_p;
  this->m_p = pIVar1;
  if (pIVar2 != (IStreamingReporter *)0x0) {
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  return this;
}

Assistant:

Ptr& operator = ( Ptr const& other ){
            Ptr temp( other );
            swap( temp );
            return *this;
        }